

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.h
# Opt level: O2

void __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::TimeZoneInfo(TimeZoneInfo *this)

{
  (this->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)&PTR__TimeZoneInfo_00437fa0;
  (this->transitions_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transitions_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transitions_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_types_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_types_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_types_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->abbreviations_)._M_dataplus._M_p = (pointer)&(this->abbreviations_).field_2;
  (this->abbreviations_)._M_string_length = 0;
  (this->abbreviations_).field_2._M_local_buf[0] = '\0';
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  (this->version_)._M_string_length = 0;
  (this->version_).field_2._M_local_buf[0] = '\0';
  (this->future_spec_)._M_dataplus._M_p = (pointer)&(this->future_spec_).field_2;
  (this->future_spec_)._M_string_length = 0;
  (this->future_spec_).field_2._M_local_buf[0] = '\0';
  (this->local_time_hint_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

TimeZoneInfo() = default;